

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchArg.h
# Opt level: O3

void __thiscall TCLAP::SwitchArg::commonProcessing(SwitchArg *this)

{
  undefined1 *puVar1;
  Visitor *pVVar2;
  CmdLineParseException *pCVar3;
  string local_60;
  string local_40;
  
  if ((this->super_Arg)._xorSet == true) {
    pCVar3 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Mutually exclusive argument already set!","");
    (*(this->super_Arg)._vptr_Arg[7])(&local_40,this);
    CmdLineParseException::CmdLineParseException(pCVar3,&local_60,&local_40);
    __cxa_throw(pCVar3,&CmdLineParseException::typeinfo,ArgException::~ArgException);
  }
  if ((this->super_Arg)._alreadySet != true) {
    (this->super_Arg)._alreadySet = true;
    puVar1 = &(this->super_Arg).field_0xa3;
    *puVar1 = *puVar1 ^ 1;
    pVVar2 = (this->super_Arg)._visitor;
    if (pVVar2 != (Visitor *)0x0) {
      (*pVVar2->_vptr_Visitor[2])();
      return;
    }
    return;
  }
  pCVar3 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Argument already set!","");
  (*(this->super_Arg)._vptr_Arg[7])(&local_40,this);
  CmdLineParseException::CmdLineParseException(pCVar3,&local_60,&local_40);
  __cxa_throw(pCVar3,&CmdLineParseException::typeinfo,ArgException::~ArgException);
}

Assistant:

inline void SwitchArg::commonProcessing()
{
  if ( _xorSet )
    throw(CmdLineParseException(
				"Mutually exclusive argument already set!", toString()));

  if ( _alreadySet ) 
    throw(CmdLineParseException("Argument already set!", toString()));

  _alreadySet = true;

  if ( _value == true )
    _value = false;
  else
    _value = true;

  _checkWithVisitor();
}